

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_7a45aa::TransformSelectorFor::~TransformSelectorFor(TransformSelectorFor *this)

{
  TransformSelectorIndexes::~TransformSelectorIndexes(&this->super_TransformSelectorIndexes);
  operator_delete(this,0x58);
  return;
}

Assistant:

TransformSelectorFor(index_type start, index_type stop, index_type step)
    : TransformSelectorIndexes("FOR")
    , Start(start)
    , Stop(stop)
    , Step(step)
  {
  }